

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O1

void detect(yolo_image *img,ggml_cgraph *gf,yolo_model *model,float thresh,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *labels,vector<yolo_image,_std::allocator<yolo_image>_> *alphabet)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  yolo_image *a;
  int iVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ggml_tensor *pgVar15;
  ulong uVar16;
  pointer pfVar17;
  vector<float,_std::allocator<float>_> *pvVar18;
  double dVar19;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]ggml_examples_yolo_yolov3_tiny_cpp:339:53)>
  __comp;
  ulong uVar20;
  int y1;
  undefined4 uVar21;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> detections_00;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> __last;
  vector<float,_std::allocator<float>_> *pvVar22;
  double dVar23;
  uint uVar24;
  pointer pdVar25;
  uint uVar26;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> __i;
  long lVar27;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> __last_00;
  long lVar28;
  int iVar29;
  float fVar30;
  int iVar32;
  undefined1 auVar31 [16];
  float fVar33;
  int y2;
  float ratio;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  initializer_list<int> __l;
  initializer_list<float> __l_00;
  initializer_list<int> __l_01;
  initializer_list<float> __l_02;
  vector<detection,_std::allocator<detection>_> detections;
  string labelstr;
  yolo_image sized;
  yolo_layer yolo23;
  yolo_layer yolo16;
  allocator_type local_211;
  float local_210;
  allocator_type local_209;
  undefined1 local_208 [16];
  pointer local_1f8;
  string local_1f0;
  ulong local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  ulong local_1c0;
  double local_1b8;
  float local_1ac;
  undefined1 local_1a8 [8];
  pointer piStack_1a0;
  pointer local_198;
  pointer pfStack_190;
  pointer local_188;
  pointer pfStack_180;
  undefined1 local_170 [8];
  float local_168;
  pointer local_160;
  double local_158;
  undefined1 local_148 [16];
  vector<yolo_image,_std::allocator<yolo_image>_> *local_130;
  yolo_image *local_128;
  undefined8 local_11c;
  undefined4 local_114;
  yolo_image local_110;
  yolo_layer local_e8;
  yolo_layer local_88;
  
  local_208 = ZEXT416(0);
  local_1f8 = (pointer)0x0;
  local_210 = thresh;
  local_1c8 = labels;
  local_130 = alphabet;
  letterbox_image(&local_110,img,model->width,model->height);
  uVar13 = ggml_graph_get_tensor(gf,"input");
  pfVar17 = local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar14 = ggml_nbytes(uVar13);
  ggml_backend_tensor_set(uVar13,pfVar17,0,uVar14);
  iVar12 = ggml_backend_graph_compute(model->backend,gf);
  if (iVar12 == 0) {
    pgVar15 = (ggml_tensor *)ggml_graph_get_tensor(gf,"layer_15");
    local_170 = (undefined1  [8])0x400000003;
    local_168 = 7.00649e-45;
    __l._M_len = 3;
    __l._M_array = (iterator)local_170;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1a8,__l,(allocator_type *)&local_11c);
    local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x4329000043070000;
    local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x439f800043ac0000;
    local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x4268000042140000;
    local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x42a4000042a20000;
    local_e8._0_8_ = 0x4160000041200000;
    local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x41d8000041b80000;
    __l_00._M_len = 0xc;
    __l_00._M_array = (iterator)&local_e8;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_1f0,__l_00,&local_211);
    yolo_layer::yolo_layer
              (&local_88,0x50,(vector<int,_std::allocator<int>_> *)local_1a8,
               (vector<float,_std::allocator<float>_> *)&local_1f0,pgVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) - (long)local_1f0._M_dataplus._M_p
                     );
    }
    if (local_1a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a8,(long)local_198 - (long)local_1a8);
    }
    apply_yolo(&local_88);
    get_yolo_detections(&local_88,(vector<detection,_std::allocator<detection>_> *)local_208,img->w,
                        img->h,model->width,model->height,local_210);
    pgVar15 = (ggml_tensor *)ggml_graph_get_tensor(gf,"layer_22");
    local_11c = 0x100000000;
    local_114 = 2;
    __l_01._M_len = 3;
    __l_01._M_array = (iterator)&local_11c;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_1f0,__l_01,(allocator_type *)&local_211);
    local_188 = (pointer)0x4329000043070000;
    pfStack_180 = (pointer)0x439f800043ac0000;
    local_198 = (pointer)0x4268000042140000;
    pfStack_190 = (pointer)0x42a4000042a20000;
    local_1a8 = (undefined1  [8])0x4160000041200000;
    piStack_1a0 = (pointer)0x41d8000041b80000;
    __l_02._M_len = 0xc;
    __l_02._M_array = (iterator)local_1a8;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_170,__l_02,&local_209);
    yolo_layer::yolo_layer
              (&local_e8,0x50,(vector<int,_std::allocator<int>_> *)&local_1f0,
               (vector<float,_std::allocator<float>_> *)local_170,pgVar15);
    if (local_170 != (undefined1  [8])0x0) {
      operator_delete((void *)local_170,(long)local_160 - (long)local_170);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) - (long)local_1f0._M_dataplus._M_p
                     );
    }
    apply_yolo(&local_e8);
    pfVar17 = (pointer)(ulong)(uint)model->height;
    detections_00._M_current = (detection *)local_208;
    get_yolo_detections(&local_e8,
                        (vector<detection,_std::allocator<detection>_> *)detections_00._M_current,
                        img->w,img->h,model->width,model->height,local_210);
    local_1d0 = local_e8._0_8_ & 0xffffffff;
    iVar12 = (int)((ulong)(local_208._8_8_ - local_208._0_8_) >> 4) * -0x55555555;
    uVar26 = iVar12 - 1;
    local_128 = img;
    if (0 < iVar12) {
      iVar12 = 0;
      do {
        iVar29 = iVar12;
        if ((((pointer)(local_208._0_8_ + (long)iVar12 * 0x30))->objectness == 0.0) &&
           (!NAN(((pointer)(local_208._0_8_ + (long)iVar12 * 0x30))->objectness))) {
          pdVar25 = (pointer)(local_208._0_8_ + (long)iVar12 * 0x30);
          local_1a8 = *(undefined1 (*) [8])&pdVar25->bbox;
          piStack_1a0 = *(pointer *)&(pdVar25->bbox).w;
          local_198 = (pdVar25->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pfStack_190 = (pdVar25->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          local_188 = (pdVar25->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          (pdVar25->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pdVar25->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pdVar25->prob).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pfStack_180 = (pointer)CONCAT44(pfStack_180._4_4_,pdVar25->objectness);
          pvVar18 = &((pointer)(local_208._0_8_ + (long)(int)uVar26 * 0x30))->prob;
          uVar13 = *(undefined8 *)((long)(pvVar18 + -1) + 8);
          uVar14 = *(undefined8 *)((long)(pvVar18 + -1) + 0x10);
          (pdVar25->bbox).x = (float)(int)uVar13;
          (pdVar25->bbox).y = (float)(int)((ulong)uVar13 >> 0x20);
          (pdVar25->bbox).w = (float)(int)uVar14;
          (pdVar25->bbox).h = (float)(int)((ulong)uVar14 >> 0x20);
          std::vector<float,_std::allocator<float>_>::_M_move_assign(&pdVar25->prob,pvVar18);
          pdVar25->objectness = *(float *)(pvVar18 + 1);
          *(undefined1 (*) [8])((long)(pvVar18 + -1) + 8) = local_1a8;
          *(pointer *)((long)(pvVar18 + -1) + 0x10) = piStack_1a0;
          detections_00._M_current = (detection *)&local_198;
          std::vector<float,_std::allocator<float>_>::_M_move_assign(pvVar18);
          *(float *)(pvVar18 + 1) = pfStack_180._0_4_;
          if (local_198 != (pointer)0x0) {
            detections_00._M_current = (detection *)((long)local_188 - (long)local_198);
            operator_delete(local_198,(ulong)detections_00._M_current);
          }
          uVar26 = uVar26 - 1;
          iVar29 = iVar12 + -1;
        }
        iVar12 = iVar29 + 1;
      } while (iVar29 < (int)uVar26);
    }
    if (0 < (int)local_1d0) {
      local_1b8 = (double)(ulong)uVar26;
      local_158 = (double)((long)(int)uVar26 * 0x30);
      local_1c0 = (long)local_158 - 0x2d0;
      uVar20 = 0;
      local_148._0_4_ = uVar26;
      do {
        uVar13 = local_208._0_8_;
        __last._M_current =
             (detection *)
             ((long)&(((detection *)(local_208._0_8_ + 0x30))->bbox).x + (long)local_158);
        if ((detection *)local_208._0_8_ != __last._M_current) {
          lVar27 = (long)__last._M_current - local_208._0_8_;
          uVar16 = (lVar27 >> 4) * -0x5555555555555555;
          lVar28 = 0x3f;
          if (uVar16 != 0) {
            for (; uVar16 >> lVar28 == 0; lVar28 = lVar28 + -1) {
            }
          }
          __comp._M_comp.k = SUB84(uVar20,0);
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                    ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                      )local_208._0_8_,__last,(ulong)(((uint)lVar28 ^ 0x3f) * 2) ^ 0x7e,__comp);
          if (lVar27 < 0x301) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                      ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                        )uVar13,__last,__comp);
            detections_00._M_current = __last._M_current;
          }
          else {
            __last_00._M_current = (detection *)(uVar13 + 0x300);
            detections_00._M_current = __last_00._M_current;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                      ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                        )uVar13,__last_00,__comp);
            uVar16 = local_1c0;
            if (__last_00._M_current != __last._M_current) {
              do {
                detections_00._M_current = (detection *)(uVar20 & 0xffffffff);
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Val_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                          (__last_00,
                           (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]ggml_examples_yolo_yolov3_tiny_cpp:339:53)>
                            )__comp._M_comp.k);
                __last_00._M_current = __last_00._M_current + 1;
                uVar16 = uVar16 - 0x30;
              } while (uVar16 != 0);
            }
          }
        }
        if (-1 < (int)local_148._0_4_) {
          pvVar18 = &((pointer)(local_208._0_8_ + 0x30))->prob;
          detections_00._M_current = (detection *)0x0;
          dVar19 = local_1b8;
          do {
            fVar30 = (((pointer)(local_208._0_8_ + detections_00._M_current * 0x30))->prob).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar20];
            if (((fVar30 != 0.0) || (NAN(fVar30))) &&
               ((long)detections_00._M_current < (long)(int)uVar26)) {
              pdVar25 = (pointer)(local_208._0_8_ + detections_00._M_current * 0x30);
              uVar1 = (pdVar25->bbox).x;
              uVar5 = (pdVar25->bbox).y;
              uVar2 = (pdVar25->bbox).w;
              uVar6 = (pdVar25->bbox).h;
              pvVar22 = pvVar18;
              dVar23 = dVar19;
              do {
                fVar34 = (float)*(undefined8 *)((long)(pvVar22 + -1) + 8);
                fVar35 = (float)((ulong)*(undefined8 *)((long)(pvVar22 + -1) + 8) >> 0x20);
                fVar30 = (float)*(undefined8 *)((long)(pvVar22 + -1) + 0x10);
                fVar33 = (float)((ulong)*(undefined8 *)((long)(pvVar22 + -1) + 0x10) >> 0x20);
                fVar38 = fVar30 * 0.5;
                fVar39 = fVar33 * 0.5;
                auVar41._0_4_ = fVar34 - fVar38;
                auVar41._4_4_ = fVar35 - fVar39;
                auVar41._8_8_ = 0;
                auVar40._4_4_ = (float)uVar5 - (float)uVar6 * 0.5;
                auVar40._0_4_ = (float)uVar1 - (float)uVar2 * 0.5;
                auVar40._8_8_ = 0;
                auVar41 = maxps(auVar40,auVar41);
                auVar36._4_4_ = (float)uVar6 * 0.5 + (float)uVar5;
                auVar36._0_4_ = (float)uVar2 * 0.5 + (float)uVar1;
                auVar36._8_8_ = 0;
                auVar11._4_4_ = fVar39 + fVar35;
                auVar11._0_4_ = fVar38 + fVar34;
                auVar11._8_8_ = 0;
                auVar37 = minps(auVar36,auVar11);
                fVar35 = auVar37._0_4_ - auVar41._0_4_;
                fVar38 = auVar37._4_4_ - auVar41._4_4_;
                iVar12 = -(uint)(fVar35 < 0.0);
                iVar29 = -(uint)(fVar38 < 0.0);
                auVar37._4_4_ = iVar12;
                auVar37._0_4_ = iVar12;
                auVar37._8_4_ = iVar29;
                auVar37._12_4_ = iVar29;
                uVar24 = movmskpd((int)pfVar17,auVar37);
                pfVar17 = (pointer)(ulong)uVar24;
                fVar34 = 0.0;
                if (uVar24 == 0) {
                  fVar34 = fVar38 * fVar35;
                }
                if (0.45 < fVar34 / ((fVar33 * fVar30 + (float)uVar6 * (float)uVar2) - fVar34)) {
                  pfVar17 = (pvVar22->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  pfVar17[uVar20] = 0.0;
                }
                pvVar22 = pvVar22 + 2;
                dVar23 = (double)((long)dVar23 - 1);
              } while (dVar23 != 0.0);
            }
            detections_00._M_current =
                 (detection *)
                 ((long)&(((_Vector_base<detection,_std::allocator<detection>_> *)
                          &(detections_00._M_current)->bbox)->_M_impl).super__Vector_impl_data.
                         _M_start + 1);
            dVar19 = (double)((long)dVar19 - 1);
            pvVar18 = pvVar18 + 2;
          } while (detections_00._M_current != (detection *)(ulong)(uVar26 + 1));
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != local_1d0);
    }
    if (0 < (int)((ulong)(local_208._8_8_ - local_208._0_8_) >> 4) * -0x55555555) {
      local_1c0 = (ulong)((long)(local_1c8->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_1c8->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 5;
      local_1ac = (float)(int)local_1c0;
      uVar20 = 0;
      do {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
        pfVar17 = (((pointer)(local_208._0_8_ + uVar20 * 0x30))->prob).
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        local_1d0 = uVar20;
        if ((int)((ulong)((long)(((pointer)(local_208._0_8_ + uVar20 * 0x30))->prob).
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pfVar17) >> 2) < 1) {
          iVar12 = -1;
        }
        else {
          iVar12 = -1;
          lVar27 = 0;
          lVar28 = 0;
          do {
            if (local_210 < pfVar17[lVar28]) {
              if (iVar12 < 0) {
                std::__cxx11::string::_M_assign((string *)&local_1f0);
                iVar12 = (int)lVar28;
              }
              else {
                std::__cxx11::string::append((char *)&local_1f0);
                std::__cxx11::string::_M_append
                          ((char *)&local_1f0,
                           *(ulong *)((long)&(((local_1c8->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar27));
              }
              detections_00._M_current =
                   *(detection **)
                    ((long)&(((local_1c8->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                    lVar27);
              printf("%s: %.0f%%\n",
                     (double)((((pointer)(local_208._0_8_ + uVar20 * 0x30))->prob).
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar28] * 100.0));
            }
            lVar28 = lVar28 + 1;
            pfVar17 = (((pointer)(local_208._0_8_ + uVar20 * 0x30))->prob).
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar27 = lVar27 + 0x20;
          } while (lVar28 < (int)((ulong)((long)(((pointer)(local_208._0_8_ + uVar20 * 0x30))->prob)
                                                .super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)pfVar17) >> 2));
        }
        a = local_128;
        uVar21 = SUB84(detections_00._M_current,0);
        pdVar25 = (pointer)(local_208._0_8_ + uVar20 * 0x30);
        if (-1 < iVar12) {
          fVar30 = ((float)((iVar12 * 0x1e241) % (int)local_1c0) / local_1ac) * 5.0;
          local_148 = ZEXT416((uint)fVar30);
          local_1b8 = (double)fVar30;
          local_158 = floor(local_1b8);
          iVar12 = (int)local_158;
          dVar19 = ceil(local_1b8);
          fVar34 = (float)local_148._0_4_ - (float)(int)local_158;
          fVar30 = 1.0 - fVar34;
          local_168 = *(float *)(&DAT_0011e600 + (long)iVar12 * 0xc) * fVar30 +
                      *(float *)(&DAT_0011e600 + (long)(int)dVar19 * 0xc) * fVar34;
          fVar33 = fVar30 * (float)*(undefined8 *)(&DAT_0011e604 + (long)iVar12 * 0xc) +
                   fVar34 * (float)*(undefined8 *)(&DAT_0011e604 + (long)(int)dVar19 * 0xc);
          fVar34 = fVar30 * (float)((ulong)*(undefined8 *)(&DAT_0011e604 + (long)iVar12 * 0xc) >>
                                   0x20) +
                   fVar34 * (float)((ulong)*(undefined8 *)(&DAT_0011e604 + (long)(int)dVar19 * 0xc)
                                   >> 0x20);
          local_170 = (undefined1  [8])CONCAT44(fVar33,fVar34);
          uVar9 = a->w;
          uVar10 = a->h;
          fVar30 = (float)(int)uVar10;
          uVar3 = (pdVar25->bbox).x;
          uVar7 = (pdVar25->bbox).y;
          uVar4 = (pdVar25->bbox).w;
          uVar8 = (pdVar25->bbox).h;
          iVar12 = (int)(((float)uVar3 - (float)uVar4 * 0.5) * (float)(int)uVar9);
          y1 = (int)(((float)uVar7 - (float)uVar8 * 0.5) * fVar30);
          iVar29 = (int)(((float)uVar4 * 0.5 + (float)uVar3) * (float)(int)uVar9);
          y2 = (int)(((float)uVar8 * 0.5 + (float)uVar7) * fVar30);
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          auVar31._0_4_ = -(uint)(iVar29 < (int)uVar9);
          iVar32 = -(uint)(y2 < (int)uVar10);
          auVar31._4_4_ = auVar31._0_4_;
          auVar31._8_4_ = iVar32;
          auVar31._12_4_ = iVar32;
          uVar26 = movmskpd(uVar21,auVar31);
          if ((uVar26 & 1) == 0) {
            iVar29 = uVar9 + -1;
          }
          if (y1 < 1) {
            y1 = 0;
          }
          if ((uVar26 & 2) == 0) {
            y2 = uVar10 + -1;
          }
          draw_box_width(a,iVar12,y1,iVar29,y2,(int)(fVar30 * 0.006),fVar34,fVar33,local_168);
          get_label((yolo_image *)local_1a8,local_130,&local_1f0,(int)((double)a->h * 0.03));
          uVar26 = y1 + (int)(fVar30 * 0.006);
          detections_00._M_current = (detection *)(ulong)uVar26;
          draw_label(a,uVar26,iVar12,(yolo_image *)local_1a8,(float *)local_170);
          if (local_198 != (pointer)0x0) {
            detections_00._M_current = (detection *)((long)local_188 - (long)local_198);
            operator_delete(local_198,(ulong)detections_00._M_current);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          detections_00._M_current =
               (detection *)
               (CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                         local_1f0.field_2._M_local_buf[0]) + 1);
          operator_delete(local_1f0._M_dataplus._M_p,(ulong)detections_00._M_current);
        }
        uVar20 = local_1d0 + 1;
      } while ((long)uVar20 <
               (long)((int)((ulong)(local_208._8_8_ - local_208._0_8_) >> 4) * -0x55555555));
    }
    if (local_e8.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_e8.predictions.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.predictions.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.anchors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_88.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_88.predictions.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.predictions.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.anchors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.anchors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    detect();
  }
  if (local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<detection,_std::allocator<detection>_>::~vector
            ((vector<detection,_std::allocator<detection>_> *)local_208);
  return;
}

Assistant:

void detect(yolo_image & img, struct ggml_cgraph * gf, const yolo_model & model, float thresh, const std::vector<std::string> & labels, const std::vector<yolo_image> & alphabet)
{
    std::vector<detection> detections;
    yolo_image sized = letterbox_image(img, model.width, model.height);
    struct ggml_tensor * input = ggml_graph_get_tensor(gf, "input");
    ggml_backend_tensor_set(input, sized.data.data(), 0, ggml_nbytes(input));

    if (ggml_backend_graph_compute(model.backend, gf) != GGML_STATUS_SUCCESS) {
        fprintf(stderr, "%s: ggml_backend_graph_compute() failed\n", __func__);
        return;
    }

    struct ggml_tensor * layer_15 = ggml_graph_get_tensor(gf, "layer_15");
    yolo_layer yolo16{ 80, {3, 4, 5}, {10, 14, 23, 27, 37,58, 81, 82, 135, 169, 344, 319}, layer_15};
    apply_yolo(yolo16);
    get_yolo_detections(yolo16, detections, img.w, img.h, model.width, model.height, thresh);

    struct ggml_tensor * layer_22 = ggml_graph_get_tensor(gf, "layer_22");
    yolo_layer yolo23{ 80, {0, 1, 2}, {10, 14, 23, 27, 37,58, 81, 82, 135, 169, 344, 319}, layer_22};
    apply_yolo(yolo23);
    get_yolo_detections(yolo23, detections, img.w, img.h, model.width, model.height, thresh);

    do_nms_sort(detections, yolo23.classes, .45);
    draw_detections(img, detections, thresh, labels, alphabet);
}